

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonBlobChangePayloadSize(JsonParse *pParse,u32 i,u32 szPayload)

{
  byte bVar1;
  uint N;
  int iVar2;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  u32 newSize;
  int delta;
  u8 nNeeded;
  u8 nExtra;
  u8 szType;
  u8 *a;
  undefined1 in_stack_ffffffffffffffdc;
  byte bVar3;
  byte bVar4;
  byte *local_20;
  int local_4;
  
  if (*(char *)((long)in_RDI + 0x2f) == '\0') {
    local_20 = (byte *)(*in_RDI + (ulong)in_ESI);
    bVar1 = (byte)((int)(uint)*local_20 >> 4);
    if (bVar1 < 0xc) {
      bVar4 = 0;
    }
    else if (bVar1 == 0xc) {
      bVar4 = 1;
    }
    else if (bVar1 == 0xd) {
      bVar4 = 2;
    }
    else {
      bVar4 = 4;
    }
    if (in_EDX < 0xc) {
      bVar3 = 0;
    }
    else if (in_EDX < 0x100) {
      bVar3 = 1;
    }
    else if (in_EDX < 0x10000) {
      bVar3 = 2;
    }
    else {
      bVar3 = 4;
    }
    local_4 = (uint)bVar3 - (uint)bVar4;
    if (local_4 != 0) {
      N = (int)in_RDI[1] + local_4;
      if (local_4 < 1) {
        memmove(local_20 + 1,local_20 + (1 - local_4),
                (ulong)((int)in_RDI[1] - ((in_ESI + 1) - local_4)));
      }
      else {
        if ((*(uint *)((long)in_RDI + 0xc) < N) &&
           (iVar2 = jsonBlobExpand((JsonParse *)
                                   CONCAT17(bVar1,CONCAT16(bVar4,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_ffffffffffffffdc,local_4)))),N),
           iVar2 != 0)) {
          return 0;
        }
        local_20 = (byte *)(*in_RDI + (ulong)in_ESI);
        memmove(local_20 + (local_4 + 1),local_20 + 1,(ulong)((int)in_RDI[1] - (in_ESI + 1)));
      }
      *(uint *)(in_RDI + 1) = N;
    }
    if (bVar3 == 0) {
      *local_20 = *local_20 & 0xf | (byte)(in_EDX << 4);
    }
    else {
      bVar1 = (byte)in_EDX;
      if (bVar3 == 1) {
        *local_20 = *local_20 & 0xf | 0xc0;
        local_20[1] = bVar1;
      }
      else {
        bVar4 = (byte)(in_EDX >> 8);
        if (bVar3 == 2) {
          *local_20 = *local_20 & 0xf | 0xd0;
          local_20[1] = bVar4;
          local_20[2] = bVar1;
        }
        else {
          *local_20 = *local_20 & 0xf | 0xe0;
          local_20[1] = (byte)(in_EDX >> 0x18);
          local_20[2] = (byte)(in_EDX >> 0x10);
          local_20[3] = bVar4;
          local_20[4] = bVar1;
        }
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int jsonBlobChangePayloadSize(
  JsonParse *pParse,
  u32 i,
  u32 szPayload
){
  u8 *a;
  u8 szType;
  u8 nExtra;
  u8 nNeeded;
  int delta;
  if( pParse->oom ) return 0;
  a = &pParse->aBlob[i];
  szType = a[0]>>4;
  if( szType<=11 ){
    nExtra = 0;
  }else if( szType==12 ){
    nExtra = 1;
  }else if( szType==13 ){
    nExtra = 2;
  }else{
    nExtra = 4;
  }
  if( szPayload<=11 ){
    nNeeded = 0;
  }else if( szPayload<=0xff ){
    nNeeded = 1;
  }else if( szPayload<=0xffff ){
    nNeeded = 2;
  }else{
    nNeeded = 4;
  }
  delta = nNeeded - nExtra;
  if( delta ){
    u32 newSize = pParse->nBlob + delta;
    if( delta>0 ){
      if( newSize>pParse->nBlobAlloc && jsonBlobExpand(pParse, newSize) ){
        return 0;  /* OOM error.  Error state recorded in pParse->oom. */
      }
      a = &pParse->aBlob[i];
      memmove(&a[1+delta], &a[1], pParse->nBlob - (i+1));
    }else{
      memmove(&a[1], &a[1-delta], pParse->nBlob - (i+1-delta));
    }
    pParse->nBlob = newSize;
  }
  if( nNeeded==0 ){
    a[0] = (a[0] & 0x0f) | (szPayload<<4);
  }else if( nNeeded==1 ){
    a[0] = (a[0] & 0x0f) | 0xc0;
    a[1] = szPayload & 0xff;
  }else if( nNeeded==2 ){
    a[0] = (a[0] & 0x0f) | 0xd0;
    a[1] = (szPayload >> 8) & 0xff;
    a[2] = szPayload & 0xff;
  }else{
    a[0] = (a[0] & 0x0f) | 0xe0;
    a[1] = (szPayload >> 24) & 0xff;
    a[2] = (szPayload >> 16) & 0xff;
    a[3] = (szPayload >> 8) & 0xff;
    a[4] = szPayload & 0xff;
  }
  return delta;
}